

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O1

void vsencoding::__vseblocks_unpack11(uint32_t *out,uint32_t *in,uint32_t bs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  if (0x1f < bs + 0x1f) {
    uVar14 = bs + 0x1f >> 5;
    auVar1 = vpmovsxbd_avx(ZEXT416(0x209141f));
    auVar10 = vpmovsxwd_avx(ZEXT816(0x7fc07ff07ff0000));
    auVar2 = vpmovsxbd_avx(ZEXT416(0x308131e));
    auVar16 = vpmovsxwd_avx512vl(ZEXT816(0x7f807ff07ff0000));
    auVar3 = vpmovsxbd_avx(ZEXT416(0x3020107));
    auVar4 = vpmovsxbd_avx(ZEXT416(0x407121d));
    auVar17 = vpmovsxwd_avx512vl(ZEXT816(0x7f007ff07ff0000));
    auVar5 = vpmovsxbd_avx(ZEXT416(0x506111c));
    auVar18 = vpmovsxwd_avx512vl(ZEXT816(0x7e007ff07ff0000));
    auVar6 = vpmovsxbd_avx(ZEXT416(0x605101b));
    auVar11 = vpmovsxwd_avx(ZEXT816(0x7c007ff07ff0000));
    auVar7 = vpmovsxbd_avx(ZEXT416(0x7040f1a));
    auVar12 = vpmovsxwd_avx(ZEXT816(0x78007ff07ff0000));
    auVar8 = vpmovsxbd_avx(ZEXT416(0x8030e19));
    auVar13 = vpmovsxwd_avx(ZEXT816(0x70007ff07ff0000));
    auVar9 = vpmovsxbd_avx(ZEXT416(0x9020d18));
    auVar19 = vpmovsxwd_avx512vl(ZEXT816(0x60007ff07ff0000));
    auVar20 = vpmovsxbd_avx512vl(ZEXT416(0xa010c17));
    auVar21 = vpmovsxwd_avx512vl(ZEXT816(0x40007ff07ff0000));
    do {
      uVar15 = *in;
      *out = uVar15 >> 0x15;
      out[1] = uVar15 >> 10 & 0x7ff;
      uVar15 = uVar15 * 2 & 0x7fe;
      out[2] = uVar15;
      auVar22 = vpbroadcastd_avx512vl(ZEXT416(in[1]));
      auVar23 = vpsrlvd_avx512vl(auVar22,auVar1);
      auVar22 = vpsllvd_avx512vl(auVar22,auVar1);
      auVar22 = vpblendd_avx2(auVar23,auVar22,8);
      auVar24 = vpinsrd_avx512dq(auVar10,uVar15,0);
      auVar24 = vpord_avx512vl(auVar23,auVar24);
      auVar22 = vpand_avx(auVar22,auVar10);
      auVar24 = vpblendd_avx2(auVar22,auVar24,1);
      *(undefined1 (*) [16])(out + 2) = auVar24;
      uVar15 = in[2];
      auVar24._4_4_ = uVar15;
      auVar24._0_4_ = uVar15;
      auVar24._8_4_ = uVar15;
      auVar24._12_4_ = uVar15;
      auVar23 = vpsrlvd_avx2(auVar24,auVar2);
      auVar24 = vpsllvd_avx2(auVar24,auVar2);
      auVar24 = vpblendd_avx2(auVar23,auVar24,8);
      auVar25 = vmovdqa64_avx512vl(auVar16);
      auVar22 = vpermt2d_avx512vl(auVar25,auVar3,auVar22);
      auVar23 = vpord_avx512vl(auVar23,auVar22);
      auVar25 = vpandd_avx512vl(auVar24,auVar22);
      auVar22 = vpblendd_avx2(auVar25,auVar23,1);
      *(undefined1 (*) [16])(out + 5) = auVar22;
      uVar15 = in[3];
      auVar26._4_4_ = uVar15;
      auVar26._0_4_ = uVar15;
      auVar26._8_4_ = uVar15;
      auVar26._12_4_ = uVar15;
      auVar23 = vpsrlvd_avx2(auVar26,auVar4);
      auVar22 = vpsllvd_avx2(auVar26,auVar4);
      auVar24 = vpblendd_avx2(auVar23,auVar22,8);
      auVar22 = vpshufd_avx(auVar25,0xff);
      auVar22 = vpor_avx(auVar23,auVar22);
      auVar25 = vpandd_avx512vl(auVar24,auVar17);
      auVar22 = vpblendd_avx2(auVar25,auVar22,1);
      *(undefined1 (*) [16])(out + 8) = auVar22;
      uVar15 = in[4];
      auVar22._4_4_ = uVar15;
      auVar22._0_4_ = uVar15;
      auVar22._8_4_ = uVar15;
      auVar22._12_4_ = uVar15;
      auVar23 = vpsrlvd_avx2(auVar22,auVar5);
      auVar22 = vpsllvd_avx2(auVar22,auVar5);
      auVar24 = vpblendd_avx2(auVar23,auVar22,8);
      auVar22 = vpshufd_avx(auVar25,0xff);
      auVar22 = vpor_avx(auVar23,auVar22);
      auVar23 = vpandd_avx512vl(auVar24,auVar18);
      auVar22 = vpblendd_avx2(auVar23,auVar22,1);
      *(undefined1 (*) [16])(out + 0xb) = auVar22;
      uVar15 = in[5];
      auVar27._4_4_ = uVar15;
      auVar27._0_4_ = uVar15;
      auVar27._8_4_ = uVar15;
      auVar27._12_4_ = uVar15;
      auVar24 = vpsrlvd_avx2(auVar27,auVar6);
      auVar22 = vpsllvd_avx2(auVar27,auVar6);
      auVar22 = vpblendd_avx2(auVar24,auVar22,8);
      auVar25 = vmovdqa64_avx512vl(auVar11);
      auVar23 = vpermt2d_avx512vl(auVar25,auVar3,auVar23);
      auVar24 = vpord_avx512vl(auVar24,auVar23);
      auVar25 = vpandd_avx512vl(auVar22,auVar23);
      auVar22 = vpblendd_avx2(auVar25,auVar24,1);
      *(undefined1 (*) [16])(out + 0xe) = auVar22;
      uVar15 = in[6];
      auVar23._4_4_ = uVar15;
      auVar23._0_4_ = uVar15;
      auVar23._8_4_ = uVar15;
      auVar23._12_4_ = uVar15;
      auVar24 = vpsrlvd_avx2(auVar23,auVar7);
      auVar22 = vpsllvd_avx2(auVar23,auVar7);
      auVar23 = vpblendd_avx2(auVar24,auVar22,8);
      auVar22 = vpshufd_avx(auVar25,0xff);
      auVar24 = vpor_avx(auVar24,auVar22);
      auVar22 = vpand_avx(auVar12,auVar23);
      auVar24 = vpblendd_avx2(auVar22,auVar24,1);
      *(undefined1 (*) [16])(out + 0x11) = auVar24;
      uVar15 = in[7];
      auVar28._4_4_ = uVar15;
      auVar28._0_4_ = uVar15;
      auVar28._8_4_ = uVar15;
      auVar28._12_4_ = uVar15;
      auVar25 = vpsrlvd_avx2(auVar28,auVar8);
      auVar24 = vpsllvd_avx2(auVar28,auVar8);
      auVar23 = vpblendd_avx2(auVar25,auVar24,8);
      auVar22 = vpshufd_avx(auVar22,0xff);
      auVar24 = vpor_avx(auVar25,auVar22);
      auVar22 = vpand_avx(auVar13,auVar23);
      auVar24 = vpblendd_avx2(auVar22,auVar24,1);
      *(undefined1 (*) [16])(out + 0x14) = auVar24;
      uVar15 = in[8];
      auVar25._4_4_ = uVar15;
      auVar25._0_4_ = uVar15;
      auVar25._8_4_ = uVar15;
      auVar25._12_4_ = uVar15;
      auVar23 = vpsrlvd_avx2(auVar25,auVar9);
      auVar24 = vpsllvd_avx2(auVar25,auVar9);
      auVar24 = vpblendd_avx2(auVar23,auVar24,8);
      auVar25 = vmovdqa64_avx512vl(auVar19);
      auVar22 = vpermt2d_avx512vl(auVar25,auVar3,auVar22);
      auVar23 = vpord_avx512vl(auVar23,auVar22);
      auVar24 = vpandd_avx512vl(auVar24,auVar22);
      auVar22 = vpblendd_avx2(auVar24,auVar23,1);
      *(undefined1 (*) [16])(out + 0x17) = auVar22;
      uVar15 = in[9];
      auVar29._4_4_ = uVar15;
      auVar29._0_4_ = uVar15;
      auVar29._8_4_ = uVar15;
      auVar29._12_4_ = uVar15;
      auVar23 = vpsrlvd_avx512vl(auVar29,auVar20);
      auVar22 = vpsllvd_avx512vl(auVar29,auVar20);
      auVar22 = vpblendd_avx2(auVar23,auVar22,8);
      auVar25 = vmovdqa64_avx512vl(auVar21);
      auVar24 = vpermt2d_avx512vl(auVar25,auVar3,auVar24);
      auVar23 = vpord_avx512vl(auVar23,auVar24);
      auVar24 = vpandd_avx512vl(auVar22,auVar24);
      auVar22 = vpblendd_avx2(auVar24,auVar23,1);
      *(undefined1 (*) [16])(out + 0x1a) = auVar22;
      uVar15 = in[10];
      out[0x1d] = auVar24._12_4_ | uVar15 >> 0x16;
      out[0x1e] = uVar15 >> 0xb & 0x7ff;
      out[0x1f] = uVar15 & 0x7ff;
      out = out + 0x20;
      in = in + 0xb;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  return;
}

Assistant:

void __vseblocks_unpack11(uint32_t *__restrict__ out,
                          const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 11, --bs) {
    out[0] = in[0] >> 21;
    out[1] = (in[0] >> 10) & 0x07ff;
    out[2] = (in[0] << 1) & 0x07ff;
    out[2] |= in[1] >> 31;
    out[3] = (in[1] >> 20) & 0x07ff;
    out[4] = (in[1] >> 9) & 0x07ff;
    out[5] = (in[1] << 2) & 0x07ff;
    out[5] |= in[2] >> 30;
    out[6] = (in[2] >> 19) & 0x07ff;
    out[7] = (in[2] >> 8) & 0x07ff;
    out[8] = (in[2] << 3) & 0x07ff;
    out[8] |= in[3] >> 29;
    out[9] = (in[3] >> 18) & 0x07ff;
    out[10] = (in[3] >> 7) & 0x07ff;
    out[11] = (in[3] << 4) & 0x07ff;
    out[11] |= in[4] >> 28;
    out[12] = (in[4] >> 17) & 0x07ff;
    out[13] = (in[4] >> 6) & 0x07ff;
    out[14] = (in[4] << 5) & 0x07ff;
    out[14] |= in[5] >> 27;
    out[15] = (in[5] >> 16) & 0x07ff;
    out[16] = (in[5] >> 5) & 0x07ff;
    out[17] = (in[5] << 6) & 0x07ff;
    out[17] |= in[6] >> 26;
    out[18] = (in[6] >> 15) & 0x07ff;
    out[19] = (in[6] >> 4) & 0x07ff;
    out[20] = (in[6] << 7) & 0x07ff;
    out[20] |= in[7] >> 25;
    out[21] = (in[7] >> 14) & 0x07ff;
    out[22] = (in[7] >> 3) & 0x07ff;
    out[23] = (in[7] << 8) & 0x07ff;
    out[23] |= in[8] >> 24;
    out[24] = (in[8] >> 13) & 0x07ff;
    out[25] = (in[8] >> 2) & 0x07ff;
    out[26] = (in[8] << 9) & 0x07ff;
    out[26] |= in[9] >> 23;
    out[27] = (in[9] >> 12) & 0x07ff;
    out[28] = (in[9] >> 1) & 0x07ff;
    out[29] = (in[9] << 10) & 0x07ff;
    out[29] |= in[10] >> 22;
    out[30] = (in[10] >> 11) & 0x07ff;
    out[31] = in[10] & 0x07ff;
  }
}